

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_update_peer_txcredit(lws *wsi,uint sid,int bump)

{
  int32_t *piVar1;
  lws *wsi_00;
  lws_h2_protocol_send *plVar2;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if (wsi == (lws *)0x0) {
    __assert_fail("wsi",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/h2/http2.c"
                  ,0x9f,"int lws_h2_update_peer_txcredit(struct lws *, unsigned int, int)");
  }
  if (bump != 0) {
    if (sid == 0xffffffff) {
      sid = (wsi->mux).my_sid;
    }
    _lws_log(8,"%s: sid %d: bump %d -> %d\n","lws_h2_update_peer_txcredit",(ulong)sid,
             (ulong)(uint)bump,(ulong)(uint)((wsi->txc).peer_tx_cr_est + bump));
    plVar2 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (plVar2 == (lws_h2_protocol_send *)0x0) {
      return 1;
    }
    plVar2->type = LWS_H2_PPS_UPDATE_WINDOW;
    (plVar2->u).rs.sid = sid;
    (plVar2->u).rs.err = bump;
    piVar1 = &(wsi->txc).peer_tx_cr_est;
    *piVar1 = *piVar1 + bump;
    lws_wsi_txc_describe(&wsi->txc,"lws_h2_update_peer_txcredit",(wsi->mux).my_sid);
    lws_pps_schedule(wsi,plVar2);
    plVar2 = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
    if (plVar2 == (lws_h2_protocol_send *)0x0) {
      return 1;
    }
    *(undefined8 *)&plVar2->type = 7;
    (plVar2->u).rs.err = bump;
    piVar1 = &(wsi_00->txc).peer_tx_cr_est;
    *piVar1 = *piVar1 + bump;
    lws_wsi_txc_describe(&wsi_00->txc,"lws_h2_update_peer_txcredit",(wsi_00->mux).my_sid);
    lws_pps_schedule(wsi_00,plVar2);
  }
  return 0;
}

Assistant:

int
lws_h2_update_peer_txcredit(struct lws *wsi, unsigned int sid, int bump)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	struct lws_h2_protocol_send *pps;

	assert(wsi);

	if (!bump)
		return 0;

	if (sid == (unsigned int)-1)
		sid = wsi->mux.my_sid;

	lwsl_info("%s: sid %d: bump %d -> %d\n", __func__, sid, bump,
			(int)wsi->txc.peer_tx_cr_est + bump);

	pps = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
	if (!pps)
		return 1;

	pps->u.update_window.sid = (unsigned int)sid;
	pps->u.update_window.credit = (unsigned int)bump;
	wsi->txc.peer_tx_cr_est += bump;

	lws_wsi_txc_describe(&wsi->txc, __func__, wsi->mux.my_sid);

	lws_pps_schedule(wsi, pps);

	pps = lws_h2_new_pps(LWS_H2_PPS_UPDATE_WINDOW);
	if (!pps)
		return 1;

	pps->u.update_window.sid = 0;
	pps->u.update_window.credit = (unsigned int)bump;
	nwsi->txc.peer_tx_cr_est += bump;

	lws_wsi_txc_describe(&nwsi->txc, __func__, nwsi->mux.my_sid);

	lws_pps_schedule(nwsi, pps);

	return 0;
}